

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstylesheetstyle.cpp
# Opt level: O0

void __thiscall QRenderRule::setClip(QRenderRule *this,QPainter *p,QRect *rect)

{
  ulong uVar1;
  QPainterPath *in_RSI;
  QPainterPath *in_RDI;
  long in_FS_OFFSET;
  QRenderRule *in_stack_000000a0;
  undefined1 in_stack_000000f0 [16];
  QPainterPath *in_stack_ffffffffffffffb8;
  int iVar2;
  QPainterPath local_10 [8];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  iVar2 = *(int *)(in_RDI + 0x78);
  *(int *)(in_RDI + 0x78) = iVar2 + 1;
  if (iVar2 == 0) {
    borderClip(in_stack_000000a0,(QRect)in_stack_000000f0);
    QPainterPath::operator=(in_RDI,in_stack_ffffffffffffffb8);
    iVar2 = (int)in_RDI;
    QPainterPath::~QPainterPath(local_10);
    uVar1 = QPainterPath::isEmpty();
    if ((uVar1 & 1) == 0) {
      QPainter::save();
      QPainter::setClipPath(in_RSI,iVar2 + 0x80);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QRenderRule::setClip(QPainter *p, const QRect &rect)
{
    if (clipset++)
        return;
    clipPath = borderClip(rect);
    if (!clipPath.isEmpty()) {
        p->save();
        p->setClipPath(clipPath, Qt::IntersectClip);
    }
}